

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::AndroidPowerConfig::Serialize(AndroidPowerConfig *this,Message *msg)

{
  AndroidPowerConfig_BatteryCounters *pAVar1;
  uint8_t *src_begin;
  ulong uVar2;
  AndroidPowerConfig_BatteryCounters *it;
  AndroidPowerConfig_BatteryCounters *pAVar3;
  
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 2) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,1,this->battery_poll_ms_);
  }
  pAVar1 = (this->battery_counters_).
           super__Vector_base<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pAVar3 = (this->battery_counters_).
                super__Vector_base<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar3 != pAVar1; pAVar3 = pAVar3 + 1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>
              (msg,2,*pAVar3);
  }
  uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar2 & 8) != 0) {
    protozero::Message::AppendTinyVarInt(msg,3,(uint)this->collect_power_rails_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 0x10) != 0) {
    protozero::Message::AppendTinyVarInt(msg,4,(uint)this->collect_energy_estimation_breakdown_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void AndroidPowerConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: battery_poll_ms
  if (_has_field_[1]) {
    msg->AppendVarInt(1, battery_poll_ms_);
  }

  // Field 2: battery_counters
  for (auto& it : battery_counters_) {
    msg->AppendVarInt(2, it);
  }

  // Field 3: collect_power_rails
  if (_has_field_[3]) {
    msg->AppendTinyVarInt(3, collect_power_rails_);
  }

  // Field 4: collect_energy_estimation_breakdown
  if (_has_field_[4]) {
    msg->AppendTinyVarInt(4, collect_energy_estimation_breakdown_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}